

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-emscripten.cpp
# Opt level: O3

void wasm::addExportedFunction(Module *wasm,Function *function)

{
  char *pcVar1;
  Export *curr;
  
  Module::addFunction(wasm,function);
  curr = (Export *)operator_new(0x28);
  pcVar1 = (function->super_Importable).super_Named.name.super_IString.str._M_str;
  (curr->value).super_IString.str._M_len =
       (function->super_Importable).super_Named.name.super_IString.str._M_len;
  (curr->value).super_IString.str._M_str = pcVar1;
  pcVar1 = (function->super_Importable).super_Named.name.super_IString.str._M_str;
  (curr->name).super_IString.str._M_len =
       (function->super_Importable).super_Named.name.super_IString.str._M_len;
  (curr->name).super_IString.str._M_str = pcVar1;
  curr->kind = Function;
  Module::addExport(wasm,curr);
  return;
}

Assistant:

void addExportedFunction(Module& wasm, Function* function) {
  wasm.addFunction(function);
  auto export_ = new Export;
  export_->name = export_->value = function->name;
  export_->kind = ExternalKind::Function;
  wasm.addExport(export_);
}